

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFuzzyImageCompare.cpp
# Opt level: O1

void tcu::separableConvolve<4,4>
               (PixelBufferAccess *dst,ConstPixelBufferAccess *src,int shiftX,int shiftY,
               vector<float,_std::allocator<float>_> *kernelX,
               vector<float,_std::allocator<float>_> *kernelY)

{
  float fVar1;
  pointer pfVar2;
  pointer pfVar3;
  pointer pfVar4;
  void *pvVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  int i;
  uint uVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  int i_2;
  int iVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  Vec4 sum;
  Vector<float,_4> res;
  PixelBufferAccess tmpAccess;
  TextureLevel tmp;
  float local_e8 [4];
  long local_d8;
  float local_d0 [4];
  void *local_c0;
  ConstPixelBufferAccess *local_b8;
  int local_b0;
  int local_ac;
  float local_a8 [4];
  PixelBufferAccess *local_98;
  void *local_90;
  void *local_88;
  PixelBufferAccess local_80;
  TextureLevel local_58;
  
  local_b0 = shiftY;
  local_ac = shiftX;
  local_98 = dst;
  TextureLevel::TextureLevel
            (&local_58,(TextureFormat *)dst,(dst->super_ConstPixelBufferAccess).m_size.m_data[1],
             (dst->super_ConstPixelBufferAccess).m_size.m_data[0],1);
  TextureLevel::getAccess(&local_80,&local_58);
  pfVar2 = (kernelY->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pfVar3 = (kernelY->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (0 < (src->m_size).m_data[1]) {
    pfVar4 = (kernelX->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_90 = local_80.super_ConstPixelBufferAccess.m_data;
    uVar6 = (uint)((ulong)((long)(kernelX->super__Vector_base<float,_std::allocator<float>_>).
                                 _M_impl.super__Vector_impl_data._M_finish - (long)pfVar4) >> 2);
    local_d8 = 0;
    do {
      iVar9 = (src->m_size).m_data[0];
      if (0 < iVar9) {
        local_88 = src->m_data;
        local_c0 = (void *)((long)((int)local_d8 * 4) +
                           (long)local_80.super_ConstPixelBufferAccess.m_data);
        iVar14 = 0;
        do {
          local_e8[0] = 0.0;
          local_e8[1] = 0.0;
          local_e8[2] = 0.0;
          local_e8[3] = 0.0;
          iVar16 = 0;
          if (0 < (int)uVar6) {
            iVar7 = (src->m_pitch).m_data[1];
            uVar8 = 0;
            do {
              iVar13 = (iVar14 - local_ac) + (uint)uVar8;
              iVar11 = iVar9 + -1;
              if (iVar13 < iVar9 + -1) {
                iVar11 = iVar13;
              }
              iVar11 = iVar11 << 2;
              if (iVar13 < 0) {
                iVar11 = iVar16;
              }
              uVar10 = *(uint *)((long)local_88 + (long)iVar11 + (long)(iVar7 * (int)local_d8));
              fVar1 = pfVar4[(int)(~(uint)uVar8 + uVar6)];
              local_d0[0] = (float)(uVar10 & 0xff);
              local_d0[1] = (float)(uVar10 >> 8 & 0xff);
              local_d0[2] = (float)(uVar10 >> 0x10 & 0xff);
              local_d0[3] = (float)(uVar10 >> 0x18);
              local_a8[0] = 0.0;
              local_a8[1] = 0.0;
              local_a8[2] = 0.0;
              local_a8[3] = 0.0;
              lVar12 = 0;
              do {
                local_a8[lVar12] = local_d0[lVar12] * fVar1;
                lVar12 = lVar12 + 1;
              } while (lVar12 != 4);
              lVar12 = 0;
              do {
                local_e8[lVar12] = local_a8[lVar12] + local_e8[lVar12];
                lVar12 = lVar12 + 1;
              } while (lVar12 != 4);
              uVar8 = uVar8 + 1;
            } while (uVar8 != (uVar6 & 0x7fffffff));
          }
          uVar10 = (uint)(local_e8[0] + 0.5);
          if (0xfe < (int)uVar10) {
            uVar10 = 0xff;
          }
          if ((int)uVar10 < 1) {
            uVar10 = 0;
          }
          iVar9 = (int)(local_e8[1] + 0.5);
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          if (iVar9 < 1) {
            iVar9 = iVar16;
          }
          iVar7 = (int)(local_e8[2] + 0.5);
          if (0xfe < iVar7) {
            iVar7 = 0xff;
          }
          if (iVar7 < 1) {
            iVar7 = iVar16;
          }
          iVar11 = (int)(local_e8[3] + 0.5);
          if (0xfe < iVar11) {
            iVar11 = 0xff;
          }
          if (iVar11 < 1) {
            iVar11 = iVar16;
          }
          *(uint *)((long)local_c0 +
                   (long)(local_80.super_ConstPixelBufferAccess.m_pitch.m_data[1] * iVar14)) =
               iVar11 << 0x18 | iVar7 << 0x10 | iVar9 << 8 | uVar10;
          iVar14 = iVar14 + 1;
          iVar9 = (src->m_size).m_data[0];
        } while (iVar14 < iVar9);
      }
      local_d8 = local_d8 + 1;
    } while (local_d8 < (src->m_size).m_data[1]);
  }
  if (0 < (src->m_size).m_data[1]) {
    pvVar5 = (local_98->super_ConstPixelBufferAccess).m_data;
    uVar6 = (uint)((ulong)((long)pfVar3 - (long)pfVar2) >> 2);
    iVar9 = 0;
    do {
      if (0 < (src->m_size).m_data[0]) {
        local_c0 = local_80.super_ConstPixelBufferAccess.m_data;
        lVar12 = 0;
        do {
          local_e8[0] = 0.0;
          local_e8[1] = 0.0;
          local_e8[2] = 0.0;
          local_e8[3] = 0.0;
          if (0 < (int)uVar6) {
            uVar8 = 0;
            do {
              iVar16 = (iVar9 - local_b0) + (uint)uVar8;
              iVar14 = local_58.m_size.m_data[0] + -1;
              if (iVar16 < local_58.m_size.m_data[0] + -1) {
                iVar14 = iVar16;
              }
              iVar14 = iVar14 << 2;
              if (iVar16 < 0) {
                iVar14 = 0;
              }
              uVar10 = *(uint *)((long)local_80.super_ConstPixelBufferAccess.m_data +
                                (long)iVar14 +
                                (long)(local_80.super_ConstPixelBufferAccess.m_pitch.m_data[1] *
                                      (int)lVar12));
              fVar1 = pfVar2[(int)(~(uint)uVar8 + uVar6)];
              local_d0[0] = (float)(uVar10 & 0xff);
              local_d0[1] = (float)(uVar10 >> 8 & 0xff);
              local_d0[2] = (float)(uVar10 >> 0x10 & 0xff);
              local_d0[3] = (float)(uVar10 >> 0x18);
              local_a8[0] = 0.0;
              local_a8[1] = 0.0;
              local_a8[2] = 0.0;
              local_a8[3] = 0.0;
              lVar15 = 0;
              do {
                local_a8[lVar15] = local_d0[lVar15] * fVar1;
                lVar15 = lVar15 + 1;
              } while (lVar15 != 4);
              lVar15 = 0;
              do {
                local_e8[lVar15] = local_a8[lVar15] + local_e8[lVar15];
                lVar15 = lVar15 + 1;
              } while (lVar15 != 4);
              uVar8 = uVar8 + 1;
            } while (uVar8 != (uVar6 & 0x7fffffff));
          }
          uVar10 = (uint)(local_e8[0] + 0.5);
          if (0xfe < (int)uVar10) {
            uVar10 = 0xff;
          }
          if ((int)uVar10 < 1) {
            uVar10 = 0;
          }
          iVar14 = (int)(local_e8[1] + 0.5);
          if (0xfe < iVar14) {
            iVar14 = 0xff;
          }
          if (iVar14 < 1) {
            iVar14 = 0;
          }
          uVar17 = (uint)(local_e8[2] + 0.5);
          if (0xfe < (int)uVar17) {
            uVar17 = 0xff;
          }
          if ((int)uVar17 < 1) {
            uVar17 = 0;
          }
          iVar16 = (int)(local_e8[3] + 0.5);
          if (0xfe < iVar16) {
            iVar16 = 0xff;
          }
          if (iVar16 < 1) {
            iVar16 = 0;
          }
          *(uint *)((long)pvVar5 +
                   (long)((int)lVar12 * 4) +
                   (long)((local_98->super_ConstPixelBufferAccess).m_pitch.m_data[1] * iVar9)) =
               iVar16 << 0x18 | uVar17 << 0x10 | iVar14 << 8 | uVar10;
          lVar12 = lVar12 + 1;
        } while (lVar12 < (src->m_size).m_data[0]);
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 < (src->m_size).m_data[1]);
  }
  local_b8 = src;
  TextureLevel::~TextureLevel(&local_58);
  return;
}

Assistant:

static void separableConvolve (const PixelBufferAccess& dst, const ConstPixelBufferAccess& src, int shiftX, int shiftY, const std::vector<float>& kernelX, const std::vector<float>& kernelY)
{
	DE_ASSERT(dst.getWidth() == src.getWidth() && dst.getHeight() == src.getHeight());

	TextureLevel		tmp			(dst.getFormat(), dst.getHeight(), dst.getWidth());
	PixelBufferAccess	tmpAccess	= tmp.getAccess();

	int kw = (int)kernelX.size();
	int kh = (int)kernelY.size();

	// Horizontal pass
	// \note Temporary surface is written in column-wise order
	for (int j = 0; j < src.getHeight(); j++)
	{
		for (int i = 0; i < src.getWidth(); i++)
		{
			Vec4 sum(0);

			for (int kx = 0; kx < kw; kx++)
			{
				float		f = kernelX[kw-kx-1];
				deUint32	p = readUnorm8<SrcChannels>(src, de::clamp(i+kx-shiftX, 0, src.getWidth()-1), j);

				sum += toFloatVec(p)*f;
			}

			writeUnorm8<DstChannels>(tmpAccess, j, i, toColor(sum));
		}
	}

	// Vertical pass
	for (int j = 0; j < src.getHeight(); j++)
	{
		for (int i = 0; i < src.getWidth(); i++)
		{
			Vec4 sum(0.0f);

			for (int ky = 0; ky < kh; ky++)
			{
				float		f = kernelY[kh-ky-1];
				deUint32	p = readUnorm8<DstChannels>(tmpAccess, de::clamp(j+ky-shiftY, 0, tmp.getWidth()-1), i);

				sum += toFloatVec(p)*f;
			}

			writeUnorm8<DstChannels>(dst, i, j, toColor(sum));
		}
	}
}